

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_task_impl.cpp
# Opt level: O0

MPP_RET mpp_task_queue_setup(MppTaskQueue queue,RK_S32 task_count)

{
  Mutex *pMVar1;
  __pthread_internal_list *p_Var2;
  list_head *head;
  int local_54;
  RK_S32 i;
  MppTaskStatusInfo *info;
  MppTaskImpl *tasks;
  AutoMutex auto_lock;
  MppTaskQueueImpl *impl;
  RK_S32 task_count_local;
  MppTaskQueue queue_local;
  
  auto_lock.mLock = (Mutex *)queue;
  Mutex::Autolock::Autolock((Autolock *)&tasks,*(Mutex **)((long)queue + 0x28),1);
  if ((auto_lock.mLock[1].mMutex.__data.__list.__next != (__pthread_internal_list *)0x0) &&
     (_mpp_log_l(2,"mpp_task_impl","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "impl->tasks == __null","mpp_task_queue_setup",0x1d7),
     (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  if ((auto_lock.mLock[1].mMutex.__data.__owner != 0) &&
     (_mpp_log_l(2,"mpp_task_impl","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "impl->task_count == 0","mpp_task_queue_setup",0x1d8),
     (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  p_Var2 = (__pthread_internal_list *)
           mpp_osal_calloc("mpp_task_queue_setup",(long)task_count * 0x30);
  pMVar1 = auto_lock.mLock;
  if (p_Var2 == (__pthread_internal_list *)0x0) {
    _mpp_log_l(2,"mpp_task_impl","malloc tasks list failed\n","mpp_task_queue_setup");
    queue_local._4_4_ = MPP_ERR_MALLOC;
  }
  else {
    auto_lock.mLock[1].mMutex.__data.__list.__next = p_Var2;
    auto_lock.mLock[1].mMutex.__data.__owner = task_count;
    head = (list_head *)(auto_lock.mLock + 2);
    for (local_54 = 0; local_54 < task_count; local_54 = local_54 + 1) {
      setup_mpp_task_name((MppTaskImpl *)(p_Var2 + (long)local_54 * 3));
      p_Var2[(long)local_54 * 3].__next =
           (__pthread_internal_list *)&p_Var2[(long)local_54 * 3].__next;
      p_Var2[(long)local_54 * 3 + 1].__prev =
           (__pthread_internal_list *)&p_Var2[(long)local_54 * 3].__next;
      *(int *)&p_Var2[(long)local_54 * 3 + 2].__prev = local_54;
      p_Var2[(long)local_54 * 3 + 1].__next = (__pthread_internal_list *)queue;
      *(undefined4 *)((long)&p_Var2[(long)local_54 * 3 + 2].__prev + 4) = 0;
      mpp_meta_get_with_tag
                (&p_Var2[(long)local_54 * 3 + 2].__next,"mpp_task_impl","mpp_task_queue_setup");
      list_add_tail((list_head *)&p_Var2[(long)local_54 * 3].__next,head);
      pMVar1[2].mMutex.__data.__kind = pMVar1[2].mMutex.__data.__kind + 1;
    }
    auto_lock.mLock[1].mMutex.__data.__nusers = 1;
    queue_local._4_4_ = MPP_OK;
  }
  Mutex::Autolock::~Autolock((Autolock *)&tasks);
  return queue_local._4_4_;
}

Assistant:

MPP_RET mpp_task_queue_setup(MppTaskQueue queue, RK_S32 task_count)
{
    MppTaskQueueImpl *impl = (MppTaskQueueImpl *)queue;
    AutoMutex auto_lock(impl->lock);

    // NOTE: queue can only be setup once
    mpp_assert(impl->tasks == NULL);
    mpp_assert(impl->task_count == 0);
    MppTaskImpl *tasks = mpp_calloc(MppTaskImpl, task_count);
    if (NULL == tasks) {
        mpp_err_f("malloc tasks list failed\n");
        return MPP_ERR_MALLOC;
    }

    impl->tasks = tasks;
    impl->task_count = task_count;

    MppTaskStatusInfo *info = &impl->info[MPP_INPUT_PORT];

    for (RK_S32 i = 0; i < task_count; i++) {
        setup_mpp_task_name(&tasks[i]);
        INIT_LIST_HEAD(&tasks[i].list);
        tasks[i].index  = i;
        tasks[i].queue  = queue;
        tasks[i].status = MPP_INPUT_PORT;
        mpp_meta_get(&tasks[i].meta);

        list_add_tail(&tasks[i].list, &info->list);
        info->count++;
    }
    impl->ready = 1;
    return MPP_OK;
}